

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O3

void do_switch(CHAR_DATA *ch,char *argument)

{
  DESCRIPTOR_DATA *pDVar1;
  bool bVar2;
  int min_level;
  CHAR_DATA *ch_00;
  char *txt;
  char arg [4608];
  char buf [4608];
  char local_2418 [4608];
  char local_1218 [4608];
  
  one_argument(argument,local_2418);
  if (local_2418[0] == '\0') {
    txt = "Switch into whom?\n\r";
  }
  else {
    if (ch->desc == (DESCRIPTOR_DATA *)0x0) {
      return;
    }
    if (ch->desc->original == (CHAR_DATA *)0x0) {
      ch_00 = get_char_world(ch,local_2418);
      if (ch_00 == (CHAR_DATA *)0x0) {
        txt = "They aren\'t here.\n\r";
      }
      else if (ch_00 == ch) {
        txt = "Ok.\n\r";
      }
      else {
        bVar2 = is_npc(ch_00);
        if (bVar2) {
          bVar2 = is_room_owner(ch,ch_00->in_room);
          if ((((bVar2) || (ch->in_room == ch_00->in_room)) ||
              (bVar2 = room_is_private(ch_00->in_room), !bVar2)) ||
             (bVar2 = is_trusted(ch,0x3c), bVar2)) {
            if (ch_00->desc == (DESCRIPTOR_DATA *)0x0) {
              sprintf(local_1218,"$N switches into %s.",ch_00->short_descr);
              min_level = get_trust(ch);
              wiznet(local_1218,ch,(OBJ_DATA *)0x0,0xd,0xc,min_level);
              pDVar1 = ch->desc;
              pDVar1->character = ch_00;
              pDVar1->original = ch;
              ch_00->desc = pDVar1;
              ch_00->pcdata = ch->pcdata;
              ch->desc = (DESCRIPTOR_DATA *)0x0;
              copy_vector(ch_00->comm,ch->comm);
              ch_00->lines = ch->lines;
              txt = "Ok.\n\r";
              ch = ch_00;
            }
            else {
              txt = "Character in use.\n\r";
            }
          }
          else {
            txt = "That character is in a private room.\n\r";
          }
        }
        else {
          txt = "You can only switch into mobiles.\n\r";
        }
      }
    }
    else {
      txt = "You are already switched.\n\r";
    }
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_switch(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH], buf[MAX_STRING_LENGTH];
	CHAR_DATA *victim;

	one_argument(argument, arg);

	if (arg[0] == '\0')
	{
		send_to_char("Switch into whom?\n\r", ch);
		return;
	}

	if (ch->desc == nullptr)
		return;

	if (ch->desc->original != nullptr)
	{
		send_to_char("You are already switched.\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (victim == ch)
	{
		send_to_char("Ok.\n\r", ch);
		return;
	}

	if (!is_npc(victim))
	{
		send_to_char("You can only switch into mobiles.\n\r", ch);
		return;
	}

	if (!is_room_owner(ch, victim->in_room)
		&& ch->in_room != victim->in_room
		&& room_is_private(victim->in_room)
		&& !is_trusted(ch, IMPLEMENTOR))
	{
		send_to_char("That character is in a private room.\n\r", ch);
		return;
	}

	if (victim->desc != nullptr)
	{
		send_to_char("Character in use.\n\r", ch);
		return;
	}

	sprintf(buf, "$N switches into %s.", victim->short_descr);
	wiznet(buf, ch, nullptr, WIZ_SWITCHES, WIZ_SECURE, get_trust(ch));

	ch->desc->character = victim;
	ch->desc->original = ch;
	victim->desc = ch->desc;
	victim->pcdata = ch->pcdata;
	ch->desc = nullptr;
	/* change communications to match */
	/*
	if (ch->prompt != nullptr)
		victim->prompt = palloc_string(ch->prompt);
	*/

	copy_vector(victim->comm, ch->comm);
	victim->lines = ch->lines;

	send_to_char("Ok.\n\r", victim);
}